

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>
::Chain_matrix(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>
               *this,uint numberOfColumns,Column_settings *colSettings)

{
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  value_type_conflict1 local_34;
  
  (this->super_Chain_pairing_option).barcode_.
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_Chain_pairing_option).barcode_.
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_Chain_pairing_option).barcode_.
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_buckets =
       &(this->super_Chain_pairing_option).indexToBar_._M_h._M_single_bucket;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_bucket_count = 1;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_element_count = 0;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Chain_pairing_option).indexToBar_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Chain_pairing_option).nextPosition_ = 0;
  (this->super_Chain_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Chain_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Chain_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Chain_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Chain_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Chain_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pmVar1 = (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
            *)operator_new(0x30);
  p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Matrix_row_access_option).rows_ = pmVar1;
  (this->matrix_).
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matrix_).
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->matrix_).
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nextIndex_ = 0;
  this->colSettings_ = colSettings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_false>_>_>_>_>
  ::reserve(&this->matrix_,(ulong)numberOfColumns);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->pivotToColumnIndex_,(ulong)numberOfColumns,&local_34);
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(unsigned int numberOfColumns,
                                                 Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      RA_opt(numberOfColumns),
      nextIndex_(0),
      colSettings_(colSettings)
{
  matrix_.reserve(numberOfColumns);
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(numberOfColumns);
  } else {
    pivotToColumnIndex_.resize(numberOfColumns, Master_matrix::template get_null_value<Index>());
  }
}